

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O2

void __thiscall CServerBrowser::QueueRequest(CServerBrowser *this,CServerEntry *pEntry)

{
  CServerEntry *pCVar1;
  CServerEntry **ppCVar2;
  
  pCVar1 = this->m_pLastReqServer;
  pEntry->m_pPrevReq = pCVar1;
  ppCVar2 = &pCVar1->m_pNextReq;
  if (pCVar1 == (CServerEntry *)0x0) {
    ppCVar2 = &this->m_pFirstReqServer;
  }
  *ppCVar2 = pEntry;
  this->m_pLastReqServer = pEntry;
  this->m_NumRequests = this->m_NumRequests + 1;
  return;
}

Assistant:

void CServerBrowser::QueueRequest(CServerEntry *pEntry)
{
	// add it to the list of servers that we should request info from
	pEntry->m_pPrevReq = m_pLastReqServer;
	if(m_pLastReqServer)
		m_pLastReqServer->m_pNextReq = pEntry;
	else
		m_pFirstReqServer = pEntry;
	m_pLastReqServer = pEntry;

	m_NumRequests++;
}